

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

void __thiscall
slang::parsing::Token::Token
          (Token *this,BumpAllocator *alloc,TokenKind kind,
          span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia,string_view rawText,
          SourceLocation location,SVInt *value)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  SVInt *pSVar6;
  Info *pIVar7;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 __dest;
  
  (this->numFlags).raw = '\0';
  this->rawLen = 0;
  this->info = (Info *)0x0;
  init(this,(EVP_PKEY_CTX *)alloc);
  uVar4 = (value->super_SVIntStorage).bitWidth;
  bVar1 = (value->super_SVIntStorage).signFlag;
  bVar2 = (value->super_SVIntStorage).unknownFlag;
  if (uVar4 < 0x41 && (bVar2 & 1U) == 0) {
    __dest = (value->super_SVIntStorage).field_0;
  }
  else {
    __dest.pVal = (uint64_t *)
                  BumpAllocator::allocate
                            (alloc,(ulong)(((uVar4 + 0x3f >> 6) << (bVar2 & 0x1fU)) << 3),8);
    uVar5 = (value->super_SVIntStorage).bitWidth;
    bVar3 = (value->super_SVIntStorage).unknownFlag;
    pSVar6 = (SVInt *)(value->super_SVIntStorage).field_0.pVal;
    if ((bVar3 & 1U) != 0) {
      value = pSVar6;
    }
    if (0x40 < uVar5) {
      value = pSVar6;
    }
    memcpy(__dest.pVal,value,(ulong)(((uVar5 + 0x3f >> 6) << (bVar3 & 0x1fU)) << 3));
  }
  pIVar7 = this->info;
  pIVar7[1].rawTextPtr = (char *)__dest;
  *(uint *)&pIVar7[1].location = uVar4;
  pIVar7[1].location.field_0x4 = bVar1;
  pIVar7[1].location.field_0x5 = bVar2;
  return;
}

Assistant:

Token::Token(BumpAllocator& alloc, TokenKind kind, std::span<Trivia const> trivia,
             std::string_view rawText, SourceLocation location, const SVInt& value) {
    SLANG_ASSERT(kind == TokenKind::IntegerLiteral);
    init(alloc, kind, trivia, rawText, location);

    SVIntStorage storage(value.getBitWidth(), value.isSigned(), value.hasUnknown());
    if (value.isSingleWord())
        storage.val = *value.getRawPtr();
    else {
        storage.pVal = (uint64_t*)alloc.allocate(sizeof(uint64_t) * value.getNumWords(),
                                                 alignof(uint64_t));
        memcpy(storage.pVal, value.getRawPtr(), sizeof(uint64_t) * value.getNumWords());
    }

    info->integer() = storage;
}